

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H19_binary_search.c
# Opt level: O1

int func(int *data,int head,int tail,int key)

{
  int iVar1;
  
  while( true ) {
    if (tail < head) {
      return -1;
    }
    iVar1 = (tail + head) / 2;
    if (data[iVar1] == key) break;
    if (key < data[iVar1]) {
      tail = iVar1 + -1;
    }
    else {
      head = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

int func(int data[], int head, int tail, int key) {
  int center = (head + tail) / 2;

  if (head > tail) {
    return -1;
  }

  else if (data[center] == key) {
    return center;
  }

  else if (data[center] > key) {
    return func(data, head, center - 1, key);
  }

  else {
    return func(data, center + 1, tail, key);
  }
}